

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O2

string * RankSerialize(string *__return_storage_ptr__,
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                      *list)

{
  long lVar1;
  value_type rank;
  string asStack_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar1 = 0; lVar1 != 0x120; lVar1 = lVar1 + 0x20) {
    std::__cxx11::string::string
              (asStack_48,(string *)((long)&list->_M_elems[0]._M_dataplus._M_p + lVar1));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string(asStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RankSerialize(std::array<std::string, 9> list)
{
	std::string serialized;

	UTIL_FOREACH(list, rank)
	{
		serialized.append(rank);
		serialized.append(",");
	}

	return serialized;
}